

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::String> * __thiscall
kj::anon_unknown_36::WebSocketPipeEnd::getPreferredExtensions
          (Maybe<kj::String> *__return_storage_ptr__,WebSocketPipeEnd *this,ExtensionsContext ctx)

{
  WebSocketPipeImpl *pWVar1;
  ArrayDisposer *pAVar2;
  NullableValue<kj::String> *pNVar3;
  String *pSVar4;
  String *pSVar5;
  String *result_1;
  undefined1 local_c0 [8];
  NullableValue<kj::String> _result4510;
  WebSocket *ws_1;
  WebSocket *_ws4509;
  String *result;
  Maybe<kj::String> local_70;
  undefined1 local_50 [8];
  NullableValue<kj::String> _result4505;
  WebSocket *ws;
  WebSocket *_ws4504;
  ExtensionsContext ctx_local;
  WebSocketPipeEnd *this_local;
  
  pWVar1 = Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::operator->(&this->out);
  pAVar2 = (ArrayDisposer *)kj::_::readMaybe<kj::WebSocket>(&pWVar1->destinationPumpingTo);
  if (pAVar2 != (ArrayDisposer *)0x0) {
    _result4505.field_1.value.content.disposer = pAVar2;
    (*pAVar2->_vptr_ArrayDisposer[0xb])(&local_70,pAVar2,(ulong)ctx);
    pNVar3 = kj::_::readMaybe<kj::String>(&local_70);
    kj::_::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_50,pNVar3);
    Maybe<kj::String>::~Maybe(&local_70);
    pSVar4 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_50);
    if (pSVar4 != (String *)0x0) {
      pSVar5 = kj::_::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_50);
      pSVar5 = mv<kj::String>(pSVar5);
      Maybe<kj::String>::Maybe(__return_storage_ptr__,pSVar5);
    }
    kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_50);
    if (pSVar4 != (String *)0x0) {
      return __return_storage_ptr__;
    }
  }
  pWVar1 = Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::operator->(&this->out);
  pAVar2 = (ArrayDisposer *)kj::_::readMaybe<kj::WebSocket>(&pWVar1->destinationPumpingFrom);
  if (pAVar2 != (ArrayDisposer *)0x0) {
    _result4510.field_1.value.content.disposer = pAVar2;
    (*pAVar2->_vptr_ArrayDisposer[0xb])((Maybe<kj::String> *)&result_1,pAVar2,(ulong)ctx);
    pNVar3 = kj::_::readMaybe<kj::String>((Maybe<kj::String> *)&result_1);
    kj::_::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_c0,pNVar3);
    Maybe<kj::String>::~Maybe((Maybe<kj::String> *)&result_1);
    pSVar4 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_c0);
    if (pSVar4 != (String *)0x0) {
      pSVar5 = kj::_::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_c0);
      pSVar5 = mv<kj::String>(pSVar5);
      Maybe<kj::String>::Maybe(__return_storage_ptr__,pSVar5);
    }
    kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_c0);
    if (pSVar4 != (String *)0x0) {
      return __return_storage_ptr__;
    }
  }
  Maybe<kj::String>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::String> getPreferredExtensions(ExtensionsContext ctx) override {
    // We want to forward this call to whatever WebSocket the other end of the pipe is pumping
    // to/from, if any. We'll check them in an arbitrary order and take the first one we see.
    // But really, the hope is that both destinationPumpingTo and destinationPumpingFrom are in fact
    // the same object. If they aren't the same, then it's not really clear whose extensions we
    // should prefer; the choice here is arbitrary.
    KJ_IF_SOME(ws, out->destinationPumpingTo) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    KJ_IF_SOME(ws, out->destinationPumpingFrom) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    return kj::none;
  }